

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToStringVisitor.cpp
# Opt level: O0

void __thiscall binlog::ToStringVisitor::visit(ToStringVisitor *this,Enum e)

{
  string_view str;
  bool bVar1;
  OstreamBuffer *this_00;
  char *in_stack_ffffffffffffffd8;
  OstreamBuffer *in_stack_ffffffffffffffe0;
  
  this_00 = (OstreamBuffer *)&stack0x00000008;
  comma((ToStringVisitor *)this_00);
  bVar1 = mserialize::string_view::empty((string_view *)((this_00->_buf)._M_elems + 8));
  if (bVar1) {
    detail::OstreamBuffer::operator<<(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    str._len = (size_t)in_stack_ffffffffffffffe0;
    str._ptr = in_stack_ffffffffffffffd8;
    detail::OstreamBuffer::operator<<(this_00,str);
  }
  else {
    detail::OstreamBuffer::operator<<(this_00,*(string_view *)((this_00->_buf)._M_elems + 8));
  }
  return;
}

Assistant:

void ToStringVisitor::visit(mserialize::Visitor::Enum e)
{
  comma();
  if (e.enumerator.empty())
  {
    _out << "0x" << e.value;
  }
  else
  {
    _out << e.enumerator;
  }
}